

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O0

size_t __thiscall tf::TFProfObserver::num_workers(TFProfObserver *this)

{
  bool bVar1;
  size_type sVar2;
  long in_RDI;
  size_t i;
  size_t w;
  ulong local_18;
  vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
  *this_00;
  
  this_00 = (vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
             *)0x0;
  local_18 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
            ::size((vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                    *)(in_RDI + 0x18));
    if (sVar2 <= local_18) break;
    std::
    vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
    ::operator[]((vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                  *)(in_RDI + 0x18),local_18);
    bVar1 = std::
            vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
            ::empty(this_00);
    this_00 = (vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
               *)((long)&(this_00->
                         super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + (ulong)((bVar1 ^ 0xffU) & 1));
    local_18 = local_18 + 1;
  }
  return (size_t)this_00;
}

Assistant:

inline size_t TFProfObserver::num_workers() const {
  size_t w = 0;
  for(size_t i=0; i<_timeline.segments.size(); ++i) {
    w += (!_timeline.segments[i].empty());
  }
  return w;
}